

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.cpp
# Opt level: O3

void __thiscall
sznet::net::KcpTcpEventLoop::removeTcpConnectionInLoop
          (KcpTcpEventLoop *this,TcpConnectionPtr *tcpConn)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Base_ptr p_Var5;
  bool bVar6;
  _Base_ptr p_Var7;
  LogStream *pLVar8;
  char **ppcVar9;
  _Base_ptr p_Var10;
  byte *pbVar11;
  ulong uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  SourceFile file;
  SourceFile file_00;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
  pVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_int>_>_>
  pVar14;
  undefined1 local_1078 [4016];
  char *local_c8 [4];
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *pcStack_78;
  code *pcStack_70;
  _Any_data local_68;
  code *pcStack_58;
  code *pcStack_50;
  _Base_ptr local_40;
  _Rb_tree_color local_34 [2];
  uint32_t conv;
  
  if (g_logLevel < 3) {
    file._8_8_ = 0x13;
    file.m_data = "KcpTcpEventLoop.cpp";
    Logger::Logger((Logger *)local_1078,file,0x28);
    uVar12 = (long)local_c8 - (long)local_c8[0];
    if (0x29 < (uint)uVar12) {
      builtin_strncpy(local_c8[0],"KcpTcpEventLoop::removeConnectionInLoop [",0x29);
      local_c8[0] = local_c8[0] + 0x29;
      uVar12 = (long)local_c8 - (long)local_c8[0];
    }
    uVar2 = (this->m_name)._M_string_length;
    if (uVar2 < (ulong)(long)(int)uVar12) {
      memcpy(local_c8[0],(this->m_name)._M_dataplus._M_p,uVar2);
      local_c8[0] = local_c8[0] + uVar2;
      uVar12 = (long)local_c8 - (long)local_c8[0];
    }
    if ((uVar12 & 0xfffffff0) != 0) {
      builtin_strncpy(local_c8[0],"] - connection ",0xf);
      local_c8[0] = local_c8[0] + 0xf;
      uVar12 = (long)local_c8 - (long)local_c8[0];
    }
    peVar3 = (tcpConn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar2 = (peVar3->m_name)._M_string_length;
    if (uVar2 < (ulong)(long)(int)uVar12) {
      memcpy(local_c8[0],(peVar3->m_name)._M_dataplus._M_p,uVar2);
      local_c8[0] = local_c8[0] + uVar2;
      uVar12 = (long)local_c8 - (long)local_c8[0];
    }
    if ((uVar12 & 0xfffffffc) != 0) {
      local_c8[0][2] = ' ';
      local_c8[0][0] = ' ';
      local_c8[0][1] = '-';
      local_c8[0] = local_c8[0] + 3;
    }
    LogStream::operator<<
              ((LogStream *)(local_1078 + 8),
               ((tcpConn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)
               ._M_ptr)->m_id);
    Logger::~Logger((Logger *)local_1078);
  }
  bVar6 = EventLoop::isInLoopThread(&this->super_EventLoop);
  if (!bVar6) {
    EventLoop::abortNotInLoopThread(&this->super_EventLoop);
  }
  peVar3 = (tcpConn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_34[0] = peVar3->m_id;
  p_Var10 = (this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var10 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    do {
      bVar6 = p_Var10[1]._M_color < local_34[0];
      if (!bVar6) {
        p_Var7 = p_Var10;
      }
      p_Var10 = (&p_Var10->_M_left)[bVar6];
    } while (p_Var10 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 != p_Var1) && (p_Var7[1]._M_color <= local_34[0])) {
      if ((element_type *)p_Var7[1]._M_parent != peVar3) {
        __assert_fail("fTcpIter->second.get() == tcpConn.get()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                      ,0x2f,
                      "void sznet::net::KcpTcpEventLoop::removeTcpConnectionInLoop(const TcpConnectionPtr &)"
                     );
      }
      pVar13 = std::
               _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
               ::equal_range(&(this->m_tcpConnections)._M_t,local_34);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
      ::_M_erase_aux(&(this->m_tcpConnections)._M_t,(_Base_ptr)pVar13.first._M_node,
                     (_Base_ptr)pVar13.second._M_node);
      p_Var10 = (this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var10 != (_Base_ptr)0x0) {
        p_Var1 = &(this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = &p_Var1->_M_header;
        do {
          bVar6 = p_Var10[1]._M_color < local_34[0];
          if (!bVar6) {
            p_Var7 = p_Var10;
          }
          p_Var10 = (&p_Var10->_M_left)[bVar6];
        } while (p_Var10 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 != p_Var1) && (p_Var7[1]._M_color <= local_34[0])) {
          p_Var10 = p_Var7[1]._M_parent;
          p_Var7 = p_Var7[1]._M_left;
          if (p_Var7 != (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&p_Var7->_M_parent = *(int *)&p_Var7->_M_parent + 1;
              UNLOCK();
            }
            else {
              *(int *)&p_Var7->_M_parent = *(int *)&p_Var7->_M_parent + 1;
            }
          }
          if (g_logLevel < 3) {
            file_00._8_8_ = 0x13;
            file_00.m_data = "KcpTcpEventLoop.cpp";
            local_40 = p_Var10;
            Logger::Logger((Logger *)local_1078,file_00,0x3e);
            uVar12 = (long)local_c8 - (long)local_c8[0];
            if (0x29 < (uint)uVar12) {
              builtin_strncpy(local_c8[0],"KcpTcpEventLoop::removeConnectionInLoop [",0x29);
              local_c8[0] = local_c8[0] + 0x29;
              uVar12 = (long)local_c8 - (long)local_c8[0];
            }
            uVar2 = (this->m_name)._M_string_length;
            if (uVar2 < (ulong)(long)(int)uVar12) {
              memcpy(local_c8[0],(this->m_name)._M_dataplus._M_p,uVar2);
              local_c8[0] = local_c8[0] + uVar2;
              uVar12 = (long)local_c8 - (long)local_c8[0];
            }
            if ((uVar12 & 0xfffffff0) != 0) {
              builtin_strncpy(local_c8[0],"] - connection ",0xf);
              local_c8[0] = local_c8[0] + 0xf;
              uVar12 = (long)local_c8 - (long)local_c8[0];
            }
            p_Var10 = local_40[1]._M_parent;
            if (p_Var10 < (_Base_ptr)(long)(int)uVar12) {
              memcpy(local_c8[0],*(void **)(local_40 + 1),(size_t)p_Var10);
              local_c8[0] = local_c8[0] + (long)&p_Var10->_M_color;
              uVar12 = (long)local_c8 - (long)local_c8[0];
            }
            p_Var10 = local_40;
            if ((uVar12 & 0xfffffffc) != 0) {
              local_c8[0][2] = ' ';
              local_c8[0][0] = ' ';
              local_c8[0][1] = '-';
              local_c8[0] = local_c8[0] + 3;
            }
            pLVar8 = LogStream::operator<<((LogStream *)(local_1078 + 8),local_40[2]._M_color);
            pbVar11 = (byte *)(pLVar8->m_buffer).m_cur;
            ppcVar9 = &(pLVar8->m_buffer).m_cur;
            uVar12 = (long)ppcVar9 - (long)pbVar11;
            if (2 < (uint)uVar12) {
              pbVar11[0] = 0x2d;
              pbVar11[1] = 0x20;
              pbVar11 = (byte *)(*ppcVar9 + 2);
              uVar12 = (long)ppcVar9 - (long)pbVar11;
              *ppcVar9 = (char *)pbVar11;
            }
            if ((uVar12 & 0xfffffffe) != 0) {
              *pbVar11 = *(int *)&p_Var10[2].field_0x4 == 4 | 0x30;
              *ppcVar9 = *ppcVar9 + 1;
            }
            Logger::~Logger((Logger *)local_1078);
          }
          pVar14 = std::
                   _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                   ::equal_range(&(this->m_crypts)._M_t,local_34);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
          ::_M_erase_aux(&(this->m_crypts)._M_t,(_Base_ptr)pVar14.first._M_node,
                         (_Base_ptr)pVar14.second._M_node);
          p_Var5 = p_Var10[2]._M_parent;
          if (p_Var5 == (_Base_ptr)0x0) {
            InetAddress::InetAddress((InetAddress *)local_1078,0,false,false);
          }
          else {
            local_1078._0_8_ = *(undefined8 *)p_Var5;
            local_1078._20_8_ = *(undefined8 *)((long)&p_Var5->_M_left + 4);
            local_1078._16_4_ =
                 (undefined4)((ulong)*(undefined8 *)((long)&p_Var5->_M_parent + 4) >> 0x20);
            local_1078._8_4_ = SUB84(p_Var5->_M_parent,0);
            local_1078._12_4_ = (undefined4)((ulong)p_Var5->_M_parent >> 0x20);
          }
          std::
          _Hashtable<sockaddr_in,_std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_std::allocator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>_>,_std::__detail::_Select1st,_sznet::net::KcpTcpEventLoop::sockaddrInKeyEqual,_sznet::net::KcpTcpEventLoop::sockaddrInKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_erase(&(this->m_addrConns)._M_h,local_1078);
          peVar3 = (tcpConn->
                   super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          ;
          p_Var4 = (tcpConn->
                   super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            }
          }
          local_88._M_unused._M_object = (void *)0x0;
          local_88._8_8_ = 0;
          pcStack_78 = (code *)0x0;
          pcStack_70 = (code *)0x0;
          local_88._M_unused._M_object = operator_new(0x20);
          pcStack_70 = std::
                       _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>_>
                       ::_M_invoke;
          *(code **)local_88._M_unused._0_8_ = TcpConnection::connectDestroyed;
          *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = 0;
          *(element_type **)((long)local_88._M_unused._0_8_ + 0x10) = peVar3;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_88._M_unused._0_8_ + 0x18)
               = p_Var4;
          pcStack_78 = std::
                       _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>_>
                       ::_M_manager;
          EventLoop::queueInLoop(&this->super_EventLoop,(Functor *)&local_88);
          if (pcStack_78 != (code *)0x0) {
            (*pcStack_78)(&local_88,&local_88,__destroy_functor);
          }
          if (p_Var7 != (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&p_Var7->_M_parent = *(int *)&p_Var7->_M_parent + 1;
              UNLOCK();
            }
            else {
              *(int *)&p_Var7->_M_parent = *(int *)&p_Var7->_M_parent + 1;
            }
          }
          local_68._M_unused._M_object = (void *)0x0;
          local_68._8_8_ = 0;
          pcStack_58 = (code *)0x0;
          pcStack_50 = (code *)0x0;
          local_68._M_unused._M_object = operator_new(0x20);
          pcStack_50 = std::
                       _Function_handler<void_(),_std::_Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>_>
                       ::_M_invoke;
          *(code **)local_68._M_unused._0_8_ = KcpConnection::forceCloseInLoop;
          *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
          *(_Base_ptr *)((long)local_68._M_unused._0_8_ + 0x10) = p_Var10;
          *(_Base_ptr *)((long)local_68._M_unused._0_8_ + 0x18) = p_Var7;
          pcStack_58 = std::
                       _Function_handler<void_(),_std::_Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>_>
                       ::_M_manager;
          EventLoop::runInLoop(&this->super_EventLoop,(Functor *)&local_68);
          if (pcStack_58 != (code *)0x0) {
            (*pcStack_58)(&local_68,&local_68,__destroy_functor);
          }
          if (p_Var7 == (_Base_ptr)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7);
          return;
        }
      }
      pVar14 = std::
               _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
               ::equal_range(&(this->m_crypts)._M_t,local_34);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
      ::_M_erase_aux(&(this->m_crypts)._M_t,(_Base_ptr)pVar14.first._M_node,
                     (_Base_ptr)pVar14.second._M_node);
      assertVessels(this);
      peVar3 = (tcpConn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var4 = (tcpConn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      local_a8._8_8_ = 0;
      local_a8._M_unused._M_object = operator_new(0x20);
      local_90 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>_>
                 ::_M_invoke;
      *(code **)local_a8._M_unused._0_8_ = TcpConnection::connectDestroyed;
      *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = 0;
      *(element_type **)((long)local_a8._M_unused._0_8_ + 0x10) = peVar3;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_a8._M_unused._0_8_ + 0x18) =
           p_Var4;
      local_98 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>_>
                 ::_M_manager;
      EventLoop::queueInLoop(&this->super_EventLoop,(Functor *)&local_a8);
      if (local_98 != (code *)0x0) {
        (*local_98)(&local_a8,&local_a8,__destroy_functor);
      }
      return;
    }
  }
  __assert_fail("fTcpIter != m_tcpConnections.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
                ,0x2e,
                "void sznet::net::KcpTcpEventLoop::removeTcpConnectionInLoop(const TcpConnectionPtr &)"
               );
}

Assistant:

void KcpTcpEventLoop::removeTcpConnectionInLoop(const TcpConnectionPtr& tcpConn)
{
	LOG_INFO << "KcpTcpEventLoop::removeConnectionInLoop [" << m_name
		<< "] - connection " << tcpConn->name() << " - " << tcpConn->id();

	assertInLoopThread();
	uint32_t conv = tcpConn->id();
	TcpConnectionMap::iterator fTcpIter = m_tcpConnections.find(conv);
	assert(fTcpIter != m_tcpConnections.end());
	assert(fTcpIter->second.get() == tcpConn.get());
	m_tcpConnections.erase(conv);
	KcpConnectionMap::iterator fKcpIter = m_kcpConnections.find(conv);
	if (fKcpIter == m_kcpConnections.end())
	{
		// 说明这个时候客户端还没有回执校验就断开了 或者 KCP主动断掉连接了
		// 有可能有，有可能没有，都删除一下
		m_crypts.erase(conv);
		assertVessels();
		queueInLoop(std::bind(&TcpConnection::connectDestroyed, tcpConn));
	}
	else
	{
		KcpConnectionPtr kcpConn = fKcpIter->second;

		LOG_INFO << "KcpTcpEventLoop::removeConnectionInLoop [" << m_name
			<< "] - connection " << kcpConn->name() << " - " << kcpConn->id() << 
			"- " << kcpConn->connected();

		// kcp conn 存在，但是也有可能没有连接成功
		m_crypts.erase(conv);
		m_addrConns.erase(*kcpConn->peerAddress().getSockAddrIn());
		// 这里不处理 m_kcpConnections
		queueInLoop(std::bind(&TcpConnection::connectDestroyed, tcpConn));
		runInLoop(std::bind(&KcpConnection::forceCloseInLoop, kcpConn));
	}
}